

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSurfacelessContextTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::SurfacelessContextCase::executeForConfig
          (SurfacelessContextCase *this,EGLDisplay display,EGLConfig config)

{
  TestLog *pTVar1;
  EGLConfig pvVar2;
  bool bVar3;
  deUint32 dVar4;
  deBool dVar5;
  int iVar6;
  NotSupportedError *this_00;
  MessageBuilder *pMVar7;
  EGLContext pvVar8;
  MessageBuilder local_6a8;
  char *local_528;
  Hex<16UL> local_520;
  MessageBuilder local_518;
  undefined4 local_394;
  MessageBuilder local_390;
  int local_20c;
  undefined1 local_208 [4];
  EGLenum err;
  UniqueContext context;
  int local_70;
  int apiNdx;
  allocator<char> local_59;
  string local_58;
  uint local_38;
  EGLint local_34;
  EGLint apiBits;
  EGLint id;
  TestLog *log;
  Library *egl;
  EGLConfig config_local;
  EGLDisplay display_local;
  SurfacelessContextCase *this_local;
  
  egl = (Library *)config;
  config_local = display;
  display_local = this;
  log = (TestLog *)
        EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  _apiBits = tcu::TestContext::getLog
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  local_34 = eglu::getConfigAttribInt((Library *)log,config_local,egl,0x3028);
  local_38 = eglu::getConfigAttribInt((Library *)log,config_local,egl,0x3040);
  pvVar2 = config_local;
  pTVar1 = log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"EGL_KHR_surfaceless_context",&local_59);
  bVar3 = eglu::hasExtension((Library *)pTVar1,pvVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"EGL_KHR_surfaceless_context not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSurfacelessContextTests.cpp"
               ,100);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  for (local_70 = 0; local_70 < 5; local_70 = local_70 + 1) {
    if ((local_38 & executeForConfig::apis[local_70].apiBit) != 0) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)&context.m_context,_apiBits,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&context.m_context,(char (*) [10])"Creating ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&executeForConfig::apis[local_70].name);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [25])" context with config ID ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_34);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&context.m_context);
      do {
        (**(code **)log->m_log)(log,executeForConfig::apis[local_70].api);
        dVar4 = (*(code *)log->m_log[6].lock)();
        eglu::checkError(dVar4,"bindAPI(apis[apiNdx].api)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSurfacelessContextTests.cpp"
                         ,0x6d);
        dVar5 = ::deGetFalse();
        pvVar2 = config_local;
        pTVar1 = log;
      } while (dVar5 != 0);
      pvVar8 = (EGLContext)
               (*(code *)log->m_log[1].lock)
                         (log,config_local,egl,0,executeForConfig::apis[local_70].ctxAttrs);
      eglu::UniqueContext::UniqueContext((UniqueContext *)local_208,(Library *)pTVar1,pvVar2,pvVar8)
      ;
      dVar4 = (*(code *)log->m_log[6].lock)();
      eglu::checkError(dVar4,"eglCreateContext()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSurfacelessContextTests.cpp"
                       ,0x70);
      pvVar2 = config_local;
      pTVar1 = log;
      pvVar8 = eglu::UniqueContext::operator*((UniqueContext *)local_208);
      iVar6 = (**(code **)&pTVar1->m_log[7].isSessionOpen)(pTVar1,pvVar2,0,0,pvVar8);
      if (iVar6 == 0) {
        local_20c = (*(code *)log->m_log[6].lock)();
        if (local_20c == 0x3009) {
          tcu::TestLog::operator<<(&local_390,_apiBits,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_390,
                              (char (*) [88])
                              "  eglMakeCurrent() failed with EGL_BAD_MATCH. Context doesn\'t support surfaceless mode."
                             );
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_390);
          local_394 = 4;
        }
        else {
          tcu::TestLog::operator<<(&local_518,_apiBits,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<(&local_518,(char (*) [18])"  Fail, context: ");
          pvVar8 = eglu::UniqueContext::operator*((UniqueContext *)local_208);
          local_520 = tcu::toHex<void_*>(pvVar8);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_520);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])", error: ");
          local_528 = eglu::getErrorName(local_20c);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_528);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_518);
          tcu::TestContext::setTestResult
                    ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx,QP_TEST_RESULT_FAIL,"Failed to make context current");
          local_394 = 4;
        }
      }
      else {
        do {
          (**(code **)&log->m_log[7].isSessionOpen)(log,config_local,0,0);
          dVar4 = (*(code *)log->m_log[6].lock)();
          eglu::checkError(dVar4,
                           "makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSurfacelessContextTests.cpp"
                           ,0x83);
          dVar5 = ::deGetFalse();
        } while (dVar5 != 0);
        tcu::TestLog::operator<<(&local_6a8,_apiBits,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_6a8,(char (*) [7])"  Pass");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_6a8);
        local_394 = 0;
      }
      eglu::UniqueContext::~UniqueContext((UniqueContext *)local_208);
    }
  }
  return;
}

Assistant:

void SurfacelessContextCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();
	TestLog&		log		= m_testCtx.getLog();
	const EGLint	id		= eglu::getConfigAttribInt(egl, display, config, EGL_CONFIG_ID);
	const EGLint	apiBits	= eglu::getConfigAttribInt(egl, display, config, EGL_RENDERABLE_TYPE);

	static const EGLint es1Attrs[] = { EGL_CONTEXT_CLIENT_VERSION,		1, EGL_NONE };
	static const EGLint es2Attrs[] = { EGL_CONTEXT_CLIENT_VERSION,		2, EGL_NONE };
	static const EGLint es3Attrs[] = { EGL_CONTEXT_MAJOR_VERSION_KHR,	3, EGL_NONE };

	static const struct
	{
		const char*		name;
		EGLenum			api;
		EGLint			apiBit;
		const EGLint*	ctxAttrs;
	} apis[] =
	{
		{ "OpenGL",			EGL_OPENGL_API,		EGL_OPENGL_BIT,			DE_NULL		},
		{ "OpenGL ES 1",	EGL_OPENGL_ES_API,	EGL_OPENGL_ES_BIT,		es1Attrs	},
		{ "OpenGL ES 2",	EGL_OPENGL_ES_API,	EGL_OPENGL_ES2_BIT,		es2Attrs	},
		{ "OpenGL ES 3",	EGL_OPENGL_ES_API,	EGL_OPENGL_ES3_BIT_KHR,	es3Attrs	},
		{ "OpenVG",			EGL_OPENVG_API,		EGL_OPENVG_BIT,			DE_NULL		}
	};

	if (!eglu::hasExtension(egl, display, "EGL_KHR_surfaceless_context"))
		TCU_THROW(NotSupportedError, "EGL_KHR_surfaceless_context not supported");

	for (int apiNdx = 0; apiNdx < (int)DE_LENGTH_OF_ARRAY(apis); apiNdx++)
	{
		if ((apiBits & apis[apiNdx].apiBit) == 0)
			continue; // Not supported API

		log << TestLog::Message << "Creating " << apis[apiNdx].name << " context with config ID " << id << TestLog::EndMessage;

		EGLU_CHECK_CALL(egl, bindAPI(apis[apiNdx].api));

		eglu::UniqueContext context(egl, display, egl.createContext(display, config, EGL_NO_CONTEXT, apis[apiNdx].ctxAttrs));
		EGLU_CHECK_MSG(egl, "eglCreateContext()");

		if (!egl.makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, *context))
		{
			const EGLenum err = egl.getError();

			if (err == EGL_BAD_MATCH)
			{
				log << TestLog::Message << "  eglMakeCurrent() failed with EGL_BAD_MATCH. Context doesn't support surfaceless mode." << TestLog::EndMessage;
				continue;
			}
			else
			{
				log << TestLog::Message << "  Fail, context: " << tcu::toHex(*context) << ", error: " << eglu::getErrorName(err) << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to make context current");
				continue;
			}
		}

		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

		log << TestLog::Message << "  Pass" << TestLog::EndMessage;
	}
}